

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

FederateState * __thiscall
helics::CommonCore::getFederate(CommonCore *this,string_view federateName)

{
  FederateState *pFVar1;
  shared_handle feds;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  shared_handle local_38;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = federateName._M_str;
  local_20._M_len = federateName._M_len;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::lock(&local_38,&this->federates);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_58,&local_20,&local_59);
  pFVar1 = gmlc::containers::
           MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::find(local_38.data,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_38.m_handle_lock);
  return pFVar1;
}

Assistant:

FederateState* CommonCore::getFederate(std::string_view federateName) const
{
    auto feds = federates.lock();
    return feds->find(std::string(federateName));
}